

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

void pnga_patch_enum(Integer g_a,Integer lo,Integer hi,void *start,void *stride)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  Integer proc;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  void *ptr;
  Integer hip;
  Integer lop;
  Integer type;
  Integer ndim;
  Integer ld;
  Integer dims [1];
  undefined1 (*local_68) [16];
  long local_60;
  long local_58;
  long local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  
  pnga_sync();
  proc = pnga_nodeid();
  pnga_check_handle(g_a,"ga_patch_enum");
  local_48 = pnga_ndim(g_a);
  if (1 < local_48) {
    pnga_error("ga_patch_enum:applicable to 1-dim arrays",local_48);
  }
  pnga_inquire(g_a,&local_50,&local_48,&local_38);
  pnga_distribution(g_a,proc,&local_58,&local_60);
  if ((local_60 < lo || local_58 < 1) || hi < local_58) goto LAB_001342fe;
  if (local_58 < lo) {
    local_58 = lo;
  }
  lVar13 = local_58;
  if (hi < local_60) {
    local_60 = hi;
  }
  lVar16 = local_60;
  pnga_access_ptr(g_a,&local_58,&local_60,&local_68,&local_40);
  if (local_50 - 0x3e9U < 0x10) {
    lVar16 = lVar16 - lVar13;
    lVar12 = lVar13 - lo;
    switch(local_50) {
    case 0x3e9:
      iVar7 = *stride;
      iVar14 = ((int)lVar13 - (int)lo) * iVar7 + *start;
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        *(int *)(*local_68 + lVar13 * 4) = iVar14;
        iVar14 = iVar14 + iVar7;
      }
      break;
    case 0x3ea:
      lVar13 = *stride;
      lVar12 = lVar12 * lVar13 + *start;
      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
        *(long *)(*local_68 + lVar15 * 8) = lVar12;
        lVar12 = lVar12 + lVar13;
      }
      break;
    case 0x3eb:
      fVar1 = *start;
      fVar2 = *stride;
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        *(float *)(*local_68 + lVar13 * 4) = (float)(lVar12 + lVar13) * fVar2 + fVar1;
      }
      break;
    case 0x3ec:
      dVar3 = *start;
      dVar4 = *stride;
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        *(double *)(*local_68 + lVar13 * 8) = (double)(lVar12 + lVar13) * dVar4 + dVar3;
      }
      break;
    default:
      goto switchD_001342b5_caseD_3ed;
    case 0x3ee:
      uVar5 = *start;
      uVar6 = *stride;
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        *(ulong *)(*local_68 + lVar13 * 8) =
             CONCAT44((float)(lVar12 + lVar13) * (float)((ulong)uVar6 >> 0x20) +
                      (float)((ulong)uVar5 >> 0x20),
                      (float)(lVar12 + lVar13) * (float)uVar6 + (float)uVar5);
      }
      break;
    case 0x3ef:
      dVar3 = *start;
      dVar4 = *(double *)((long)start + 8);
      dVar10 = *stride;
      dVar11 = *(double *)((long)stride + 8);
      for (lVar13 = 0; lVar13 <= lVar16; lVar13 = lVar13 + 1) {
        dVar9 = (double)(lVar12 + lVar13) * dVar11 + dVar4;
        auVar8._8_4_ = SUB84(dVar9,0);
        auVar8._0_8_ = (double)(lVar12 + lVar13) * dVar10 + dVar3;
        auVar8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        *local_68 = auVar8;
        local_68 = local_68 + 1;
      }
      break;
    case 0x3f8:
      lVar13 = *stride;
      lVar12 = lVar12 * lVar13 + *start;
      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
        *(long *)(*local_68 + lVar15 * 8) = lVar12;
        lVar12 = lVar12 + lVar13;
      }
    }
  }
  else {
switchD_001342b5_caseD_3ed:
    pnga_error("ga_patch_enum:wrong data type ",local_50);
  }
  pnga_release_update(g_a,&local_58,&local_60);
LAB_001342fe:
  pnga_sync();
  return;
}

Assistant:

void pnga_patch_enum(Integer g_a, Integer lo, Integer hi, void* start, void* stride)
{
Integer dims[1],lop,hip;
Integer ndim, type, me, off;

   pnga_sync();
   me = pnga_nodeid();

   pnga_check_handle(g_a, "ga_patch_enum");

   ndim = pnga_ndim(g_a);
   if (ndim > 1) pnga_error("ga_patch_enum:applicable to 1-dim arrays",ndim);

   pnga_inquire(g_a, &type, &ndim, dims);
   pnga_distribution(g_a, me, &lop, &hip);

   if ( lop > 0 ){ /* we get 0 if no elements stored on this process */

      /* take product of patch owned and specified by the user */ 
      if(hi <lop || hip <lo); /* we got no elements to update */
      else{
        void *ptr;
        Integer ld;
        register Integer i;
        register Integer nelem;

        if(lop < lo)lop = lo;
        if(hip > hi)hip = hi;
        nelem = hip-lop+1;
        off = lop - lo;
        pnga_access_ptr(g_a, &lop, &hip, &ptr, &ld);
        
        switch (type) {
#define TYPE_CASE(MT,T,AT)                                                  \
            case MT:                                                        \
                {                                                           \
                    T *aptr = (T*)ptr;                                      \
                    T astart = *((T*)start);                                \
                    T astride = *((T*)stride);                              \
                    for (i=0; i<nelem; i++) {                               \
                        T offset;                                           \
                        assign_mul_constant_##AT(offset,off+i,astride);     \
                        assign_add_##AT(aptr[i],astart,offset);             \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            default: pnga_error("ga_patch_enum:wrong data type ",type);
        }

        pnga_release_update(g_a, &lop, &hip);
      }
   }
   
   pnga_sync();
}